

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

weak_ordering compareThreeWay(QDateTime *lhs,QDateTime *rhs)

{
  QDateTimePrivate *pQVar1;
  QDateTimePrivate *pQVar2;
  bool bVar3;
  long lVar4;
  qint64 qVar5;
  qint64 qVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  Int IVar12;
  Int IVar13;
  bool bVar14;
  
  pQVar1 = (lhs->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar8 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar8 = (uint)pQVar1;
  }
  pQVar2 = (rhs->d).d;
  uVar10 = (uint)pQVar2;
  if ((uVar8 & 8) == 0) {
    if (((ulong)pQVar2 & 1) == 0) {
      uVar10 = (pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
               super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    return (weak_ordering)(char)((int)(uVar10 << 0x1c) >> 0x1f);
  }
  if (((ulong)pQVar2 & 1) == 0) {
    uVar10 = (pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
             super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if ((uVar10 & 8) == 0) {
    return (weak_ordering)'\x01';
  }
  if (((ulong)pQVar1 & 1) == 0) {
    lVar4 = pQVar1->m_msecs;
  }
  else {
    lVar4 = (long)pQVar1 >> 8;
  }
  if (((ulong)pQVar2 & 1) == 0) {
    qVar5 = pQVar2->m_msecs;
  }
  else {
    qVar5 = (long)pQVar2 >> 8;
  }
  if (((ulong)pQVar1 & 1) == 0) {
    IVar12 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
             super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    IVar12 = (Int)(byte)pQVar1;
  }
  if (((ulong)pQVar2 & 1) == 0) {
    IVar13 = (pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
             super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    IVar13 = (Int)(byte)pQVar2;
  }
  if ((IVar12 != IVar13) ||
     (((IVar12 & 0x20) != 0 && (pQVar1->m_offsetFromUtc != pQVar2->m_offsetFromUtc)))) {
    uVar11 = lVar4 - qVar5;
    uVar9 = -uVar11;
    if (0 < (long)uVar11) {
      uVar9 = uVar11;
    }
    if ((!SBORROW8(lVar4,qVar5)) && (uVar9 < 0x6ddd001)) {
      qVar5 = QDateTime::toMSecsSinceEpoch(lhs);
      qVar6 = QDateTime::toMSecsSinceEpoch(rhs);
      bVar3 = qVar5 < qVar6;
      bVar14 = qVar5 == qVar6;
      goto LAB_0034add7;
    }
  }
  bVar3 = lVar4 < qVar5;
  bVar14 = lVar4 == qVar5;
LAB_0034add7:
  bVar7 = -bVar3 | 1;
  if (bVar14) {
    bVar7 = 0;
  }
  return (weak_ordering)bVar7;
}

Assistant:

Qt::weak_ordering compareThreeWay(const QDateTime &lhs, const QDateTime &rhs)
{
    if (!lhs.isValid())
        return rhs.isValid() ? Qt::weak_ordering::less : Qt::weak_ordering::equivalent;

    if (!rhs.isValid())
        return Qt::weak_ordering::greater; // we know that lhs is valid here

    const qint64 lhms = getMSecs(lhs.d), rhms = getMSecs(rhs.d);
    if (usesSameOffset(lhs.d, rhs.d) || areFarEnoughApart(lhms, rhms))
        return Qt::compareThreeWay(lhms, rhms);

    // Convert to UTC and compare
    return Qt::compareThreeWay(lhs.toMSecsSinceEpoch(), rhs.toMSecsSinceEpoch());
}